

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidSliceStaticNoParams(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  Arena *pAVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  string *psVar7;
  long lVar8;
  ostream *poVar9;
  undefined1 local_178 [8];
  Result res5;
  Result res4;
  Result res3;
  Result res2;
  undefined1 local_d0 [8];
  Result res1;
  SliceStaticLayerParams *params;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *inShape;
  FeatureDescription *in;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"input",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"output",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,2);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this,EXACT_ARRAY_MAPPING);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  res1.m_message.field_2._8_8_ =
       CoreML::Specification::NeuralNetworkLayer::mutable_slicestatic(this_00);
  CoreML::Specification::SliceStaticLayerParams::add_endmasks
            ((SliceStaticLayerParams *)res1.m_message.field_2._8_8_,true);
  CoreML::validate<(MLModelType)500>((Result *)local_d0,(Model *)&in);
  bVar1 = CoreML::Result::good((Result *)local_d0);
  if (bVar1) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x157a);
    poVar9 = std::operator<<(poVar9,": error: ");
    poVar9 = std::operator<<(poVar9,"!((res1).good())");
    poVar9 = std::operator<<(poVar9," was false, expected true.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    psVar7 = CoreML::Result::message_abi_cxx11_((Result *)local_d0);
    lVar8 = std::__cxx11::string::find((char *)psVar7,0x553dc8);
    if (lVar8 == -1) {
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar9 = std::operator<<(poVar9,":");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x157b);
      poVar9 = std::operator<<(poVar9,": error: ");
      poVar9 = std::operator<<(poVar9,"res1.message().find(\"Begin IDs\") != std::string::npos");
      poVar9 = std::operator<<(poVar9," was false, expected true.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      CoreML::Specification::SliceStaticLayerParams::add_beginids
                ((SliceStaticLayerParams *)res1.m_message.field_2._8_8_,0);
      CoreML::validate<(MLModelType)500>((Result *)((long)&res3.m_message.field_2 + 8),(Model *)&in)
      ;
      bVar1 = CoreML::Result::good((Result *)((long)&res3.m_message.field_2 + 8));
      if (bVar1) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar9 = std::operator<<(poVar9,":");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1580);
        poVar9 = std::operator<<(poVar9,": error: ");
        poVar9 = std::operator<<(poVar9,"!((res2).good())");
        poVar9 = std::operator<<(poVar9," was false, expected true.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
      }
      else {
        psVar7 = CoreML::Result::message_abi_cxx11_((Result *)((long)&res3.m_message.field_2 + 8));
        lVar8 = std::__cxx11::string::find((char *)psVar7,0x553e19);
        if (lVar8 == -1) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,":");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1581);
          poVar9 = std::operator<<(poVar9,": error: ");
          poVar9 = std::operator<<(poVar9,"res2.message().find(\"End IDs\") != std::string::npos");
          poVar9 = std::operator<<(poVar9," was false, expected true.");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          m._oneof_case_[0] = 1;
        }
        else {
          CoreML::Specification::SliceStaticLayerParams::add_endids
                    ((SliceStaticLayerParams *)res1.m_message.field_2._8_8_,5);
          CoreML::validate<(MLModelType)500>
                    ((Result *)((long)&res4.m_message.field_2 + 8),(Model *)&in);
          bVar1 = CoreML::Result::good((Result *)((long)&res4.m_message.field_2 + 8));
          if (bVar1) {
            poVar9 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar9 = std::operator<<(poVar9,":");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1586);
            poVar9 = std::operator<<(poVar9,": error: ");
            poVar9 = std::operator<<(poVar9,"!((res3).good())");
            poVar9 = std::operator<<(poVar9," was false, expected true.");
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            m._oneof_case_[0] = 1;
          }
          else {
            psVar7 = CoreML::Result::message_abi_cxx11_
                               ((Result *)((long)&res4.m_message.field_2 + 8));
            lVar8 = std::__cxx11::string::find((char *)psVar7,0x553e66);
            if (lVar8 == -1) {
              poVar9 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar9 = std::operator<<(poVar9,":");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1587);
              poVar9 = std::operator<<(poVar9,": error: ");
              poVar9 = std::operator<<(poVar9,
                                       "res3.message().find(\"Strides\") != std::string::npos");
              poVar9 = std::operator<<(poVar9," was false, expected true.");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              m._oneof_case_[0] = 1;
            }
            else {
              CoreML::Specification::SliceStaticLayerParams::add_strides
                        ((SliceStaticLayerParams *)res1.m_message.field_2._8_8_,1);
              CoreML::validate<(MLModelType)500>
                        ((Result *)((long)&res5.m_message.field_2 + 8),(Model *)&in);
              bVar1 = CoreML::Result::good((Result *)((long)&res5.m_message.field_2 + 8));
              if (bVar1) {
                poVar9 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                        );
                poVar9 = std::operator<<(poVar9,":");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x158c);
                poVar9 = std::operator<<(poVar9,": error: ");
                poVar9 = std::operator<<(poVar9,"!((res4).good())");
                poVar9 = std::operator<<(poVar9," was false, expected true.");
                std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                m._oneof_case_[0] = 1;
              }
              else {
                psVar7 = CoreML::Result::message_abi_cxx11_
                                   ((Result *)((long)&res5.m_message.field_2 + 8));
                lVar8 = std::__cxx11::string::find((char *)psVar7,0x553eb3);
                if (lVar8 == -1) {
                  poVar9 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                          );
                  poVar9 = std::operator<<(poVar9,":");
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x158d);
                  poVar9 = std::operator<<(poVar9,": error: ");
                  poVar9 = std::operator<<(poVar9,
                                           "res4.message().find(\"Begin masks\") != std::string::npos"
                                          );
                  poVar9 = std::operator<<(poVar9," was false, expected true.");
                  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                  m._oneof_case_[0] = 1;
                }
                else {
                  CoreML::Specification::SliceStaticLayerParams::add_beginmasks
                            ((SliceStaticLayerParams *)res1.m_message.field_2._8_8_,true);
                  CoreML::Specification::SliceStaticLayerParams::clear_endmasks
                            ((SliceStaticLayerParams *)res1.m_message.field_2._8_8_);
                  CoreML::validate<(MLModelType)500>((Result *)local_178,(Model *)&in);
                  bVar1 = CoreML::Result::good((Result *)local_178);
                  if (bVar1) {
                    poVar9 = std::operator<<((ostream *)&std::cout,
                                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                            );
                    poVar9 = std::operator<<(poVar9,":");
                    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1593);
                    poVar9 = std::operator<<(poVar9,": error: ");
                    poVar9 = std::operator<<(poVar9,"!((res5).good())");
                    poVar9 = std::operator<<(poVar9," was false, expected true.");
                    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                    m._oneof_case_[0] = 1;
                  }
                  else {
                    psVar7 = CoreML::Result::message_abi_cxx11_((Result *)local_178);
                    lVar8 = std::__cxx11::string::find((char *)psVar7,0x553f08);
                    if (lVar8 == -1) {
                      poVar9 = std::operator<<((ostream *)&std::cout,
                                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                              );
                      poVar9 = std::operator<<(poVar9,":");
                      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1594);
                      poVar9 = std::operator<<(poVar9,": error: ");
                      poVar9 = std::operator<<(poVar9,
                                               "res5.message().find(\"End masks\") != std::string::npos"
                                              );
                      poVar9 = std::operator<<(poVar9," was false, expected true.");
                      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                      m._oneof_case_[0] = 1;
                    }
                    else {
                      m._oneof_case_[0] = 0;
                    }
                  }
                  CoreML::Result::~Result((Result *)local_178);
                }
              }
              CoreML::Result::~Result((Result *)((long)&res5.m_message.field_2 + 8));
            }
          }
          CoreML::Result::~Result((Result *)((long)&res4.m_message.field_2 + 8));
        }
      }
      CoreML::Result::~Result((Result *)((long)&res3.m_message.field_2 + 8));
    }
  }
  CoreML::Result::~Result((Result *)local_d0);
  CoreML::Specification::Model::~Model((Model *)&in);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidSliceStaticNoParams() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // missing required parameters

    auto* params = layers->mutable_slicestatic();
    params->add_endmasks(true);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Begin IDs") != std::string::npos);

    params->add_beginids(0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("End IDs") != std::string::npos);

    params->add_endids(5);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Strides") != std::string::npos);

    params->add_strides(1);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Begin masks") != std::string::npos);

    params->add_beginmasks(true);
    params->clear_endmasks();

    Result res5 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res5);
    ML_ASSERT(res5.message().find("End masks") != std::string::npos);

    return 0;

}